

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_filter.c
# Opt level: O1

void FilterSegment(double *in_data,PitchFilterParam *parameters,double *out_data,
                  double (*out_dg) [264])

{
  double dVar1;
  int iVar2;
  int iVar3;
  PitchFilterOperation PVar4;
  uint uVar5;
  double *pdVar6;
  bool bVar7;
  long lVar8;
  double *pdVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double (*padVar16) [5];
  double *pdVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  long local_78;
  
  iVar2 = parameters->num_samples;
  if (0 < iVar2) {
    iVar3 = parameters->lag_offset;
    lVar8 = (long)parameters->index;
    iVar10 = parameters->index + 0xbe;
    lVar18 = (long)iVar10;
    pdVar6 = parameters->interpol_coeff;
    PVar4 = parameters->mode;
    pdVar17 = parameters->buffer + (iVar10 - iVar3);
    local_78 = lVar8 * 8 + (long)iVar3 * -8 + (long)out_dg;
    iVar10 = 0;
    do {
      dVar19 = parameters->damper_state[0];
      dVar1 = parameters->damper_state[1];
      dVar20 = parameters->damper_state[3];
      parameters->damper_state[3] = parameters->damper_state[2];
      parameters->damper_state[4] = dVar20;
      parameters->damper_state[1] = dVar19;
      parameters->damper_state[2] = dVar1;
      dVar19 = 0.0;
      lVar12 = 0;
      do {
        dVar19 = dVar19 + pdVar17[lVar12] * pdVar6[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 9);
      dVar1 = parameters->gain;
      parameters->damper_state[0] = dVar19 * dVar1;
      if (PVar4 == kPitchFilterPreGain) {
        lVar12 = lVar8 - iVar3;
        pdVar9 = parameters->damper_state_dg[0] + 4;
        uVar13 = 4;
        do {
          lVar15 = 0;
          do {
            *(undefined8 *)((long)pdVar9 + lVar15) = *(undefined8 *)((long)pdVar9 + lVar15 + -8);
            lVar15 = lVar15 + 0x28;
          } while (lVar15 != 0xa0);
          pdVar9 = pdVar9 + -1;
          bVar7 = 1 < uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar7);
        uVar5 = parameters->sub_frame;
        if (-1 < (int)uVar5) {
          uVar11 = (uint)(lVar12 >> 0x3f) & -(int)lVar12;
          lVar15 = 0;
          lVar12 = local_78;
          do {
            dVar20 = 0.0;
            if ((int)uVar11 < 9) {
              lVar14 = 9;
              do {
                dVar20 = dVar20 + *(double *)(lVar12 + -8 + lVar14 * 8) *
                                  parameters->interpol_coeff[lVar14 + -1];
                lVar14 = lVar14 + -1;
              } while ((int)uVar11 < lVar14);
            }
            parameters->damper_state_dg[lVar15][0] =
                 parameters->gain_mult[lVar15] * dVar19 + dVar20 * dVar1;
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 0x840;
          } while (lVar15 != (ulong)uVar5 + 1);
        }
        if (-1 < (int)uVar5) {
          uVar13 = 0;
          padVar16 = parameters->damper_state_dg;
          do {
            dVar19 = 0.0;
            lVar12 = 0;
            do {
              dVar19 = dVar19 - *(double *)((long)*padVar16 + lVar12) *
                                *(double *)((long)kDampFilter + lVar12);
              lVar12 = lVar12 + 8;
            } while (lVar12 != 0x28);
            out_dg[uVar13][lVar8] = dVar19;
            uVar13 = uVar13 + 1;
            padVar16 = padVar16 + 1;
          } while (uVar13 != uVar5 + 1);
        }
      }
      dVar19 = 0.0;
      lVar12 = 0;
      do {
        dVar19 = dVar19 + *(double *)((long)parameters->damper_state + lVar12) *
                          *(double *)((long)kDampFilter + lVar12);
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x28);
      dVar1 = in_data[lVar8];
      out_data[lVar8] = dVar1 - dVar19;
      parameters->buffer[lVar18] = (dVar1 - dVar19) + in_data[lVar8];
      lVar8 = lVar8 + 1;
      lVar18 = lVar18 + 1;
      iVar10 = iVar10 + 1;
      pdVar17 = pdVar17 + 1;
      local_78 = local_78 + 8;
    } while (iVar10 != iVar2);
    parameters->index = (int)lVar8;
  }
  return;
}

Assistant:

static void FilterSegment(const double* in_data, PitchFilterParam* parameters,
                          double* out_data,
                          double out_dg[][PITCH_FRAME_LEN + QLOOKAHEAD]) {
  int n;
  int m;
  int j;
  double sum;
  double sum2;
  /* Index of |parameters->buffer| where the output is written to. */
  int pos = parameters->index + PITCH_BUFFSIZE;
  /* Index of |parameters->buffer| where samples are read for fractional-lag
   * computation. */
  int pos_lag = pos - parameters->lag_offset;

  for (n = 0; n < parameters->num_samples; ++n) {
    /* Shift low pass filter states. */
    for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
      parameters->damper_state[m] = parameters->damper_state[m - 1];
    }
    /* Filter to get fractional pitch. */
    sum = 0.0;
    for (m = 0; m < PITCH_FRACORDER; ++m) {
      sum += parameters->buffer[pos_lag + m] * parameters->interpol_coeff[m];
    }
    /* Multiply with gain. */
    parameters->damper_state[0] = parameters->gain * sum;

    if (parameters->mode == kPitchFilterPreGain) {
      int lag_index = parameters->index - parameters->lag_offset;
      int m_tmp = (lag_index < 0) ? -lag_index : 0;
      /* Update the damper state for the new sample. */
      for (m = PITCH_DAMPORDER - 1; m > 0; --m) {
        for (j = 0; j < 4; ++j) {
          parameters->damper_state_dg[j][m] =
              parameters->damper_state_dg[j][m - 1];
        }
      }

      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        /* Filter for fractional pitch. */
        sum2 = 0.0;
        for (m = PITCH_FRACORDER-1; m >= m_tmp; --m) {
          /* |lag_index + m| is always larger than or equal to zero, see how
           * m_tmp is computed. This is equivalent to assume samples outside
           * |out_dg[j]| are zero. */
          sum2 += out_dg[j][lag_index + m] * parameters->interpol_coeff[m];
        }
        /* Add the contribution of differential gain change. */
        parameters->damper_state_dg[j][0] = parameters->gain_mult[j] * sum +
            parameters->gain * sum2;
      }

      /* Filter with damping filter, and store the results. */
      for (j = 0; j < parameters->sub_frame + 1; ++j) {
        sum = 0.0;
        for (m = 0; m < PITCH_DAMPORDER; ++m) {
          sum -= parameters->damper_state_dg[j][m] * kDampFilter[m];
        }
        out_dg[j][parameters->index] = sum;
      }
    }
    /* Filter with damping filter. */
    sum = 0.0;
    for (m = 0; m < PITCH_DAMPORDER; ++m) {
      sum += parameters->damper_state[m] * kDampFilter[m];
    }

    /* Subtract from input and update buffer. */
    out_data[parameters->index] = in_data[parameters->index] - sum;
    parameters->buffer[pos] = in_data[parameters->index] +
        out_data[parameters->index];

    ++parameters->index;
    ++pos;
    ++pos_lag;
  }
  return;
}